

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
::attach(flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
         *this,char *buffer_begin,char *last_element,char *buffer_end)

{
  if ((this->buffer_).v2_.begin != buffer_begin) {
    if (last_element == (char *)0x0) {
      if (buffer_end <= buffer_begin) goto LAB_0010c59a;
    }
    else if ((last_element <= buffer_begin) || (buffer_end <= last_element)) goto LAB_0010c59a;
    clear(this);
    (this->buffer_).v2_.begin = buffer_begin;
    (this->buffer_).v2_.end = buffer_end;
    (this->buffer_).v2_.last = last_element;
    return;
  }
LAB_0010c59a:
  std::terminate();
}

Assistant:

void attach(char *buffer_begin,
                char *last_element,
                char *buffer_end) noexcept {

        FFL_CODDING_ERROR_IF(buff().begin == buffer_begin);
        if (last_element) {
            FFL_CODDING_ERROR_IF_NOT(buffer_begin < last_element && last_element < buffer_end);
        } else {
            FFL_CODDING_ERROR_IF_NOT(buffer_begin < buffer_end);
        }
        clear();
        buff().begin = buffer_begin;
        buff().end = buffer_end;
        buff().last = last_element;
    }